

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax_n_helpers.hpp
# Opt level: O3

void __thiscall
duckdb::BinaryAggregateHeap<int,_double,_duckdb::GreaterThan>::Insert
          (BinaryAggregateHeap<int,_double,_duckdb::GreaterThan> *this,ArenaAllocator *allocator,
          int *key,double *value)

{
  uint uVar1;
  int iVar2;
  ulong __holeIndex;
  pair<duckdb::HeapEntry<int>,_duckdb::HeapEntry<double>_> *__first;
  HeapEntry<double> HVar3;
  pair<duckdb::HeapEntry<int>,_duckdb::HeapEntry<double>_> __value;
  pair<duckdb::HeapEntry<int>,_duckdb::HeapEntry<double>_> __value_00;
  _Iter_comp_val<bool_(*)(const_std::pair<duckdb::HeapEntry<int>,_duckdb::HeapEntry<double>_>_&,_const_std::pair<duckdb::HeapEntry<int>,_duckdb::HeapEntry<double>_>_&)>
  __cmp;
  _Iter_comp_val<bool_(*)(const_std::pair<duckdb::HeapEntry<int>,_duckdb::HeapEntry<double>_>_&,_const_std::pair<duckdb::HeapEntry<int>,_duckdb::HeapEntry<double>_>_&)>
  local_20;
  
  __first = this->heap;
  __holeIndex = this->size;
  if (__holeIndex < this->capacity) {
    __first[__holeIndex].first.value = *key;
    __first[__holeIndex].second.value = *value;
    this->size = __holeIndex + 1;
    uVar1 = __first[__holeIndex].first.value;
    HVar3.value = __first[__holeIndex].second.value;
  }
  else {
    uVar1 = *key;
    iVar2 = (__first->first).value;
    if ((int)uVar1 <= iVar2) {
      return;
    }
    if (1 < (long)__holeIndex) {
      __value._4_4_ = 0;
      __value.first.value = __first[__holeIndex - 1].first.value;
      HVar3.value = __first[__holeIndex - 1].second.value;
      __first[__holeIndex - 1].first.value = iVar2;
      __first[__holeIndex - 1].second.value = (__first->second).value;
      __value.second.value = HVar3.value;
      std::
      __adjust_heap<std::pair<duckdb::HeapEntry<int>,duckdb::HeapEntry<double>>*,long,std::pair<duckdb::HeapEntry<int>,duckdb::HeapEntry<double>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::pair<duckdb::HeapEntry<int>,duckdb::HeapEntry<double>>const&,std::pair<duckdb::HeapEntry<int>,duckdb::HeapEntry<double>>const&)>>
                (__first,0,(long)(__holeIndex * 0x10 + -0x10) >> 4,__value,
                 (_Iter_comp_iter<bool_(*)(const_std::pair<duckdb::HeapEntry<int>,_duckdb::HeapEntry<double>_>_&,_const_std::pair<duckdb::HeapEntry<int>,_duckdb::HeapEntry<double>_>_&)>
                  )Compare);
      __first = this->heap;
      __holeIndex = this->size;
      uVar1 = *key;
    }
    __first[__holeIndex - 1].first.value = uVar1;
    HVar3.value = *value;
    __first[__holeIndex - 1].second.value = HVar3.value;
    __holeIndex = ((long)(__holeIndex * 0x10) >> 4) - 1;
  }
  local_20._M_comp = Compare;
  __value_00._4_4_ = 0;
  __value_00.first.value = uVar1;
  __value_00.second.value = HVar3.value;
  std::
  __push_heap<std::pair<duckdb::HeapEntry<int>,duckdb::HeapEntry<double>>*,long,std::pair<duckdb::HeapEntry<int>,duckdb::HeapEntry<double>>,__gnu_cxx::__ops::_Iter_comp_val<bool(*)(std::pair<duckdb::HeapEntry<int>,duckdb::HeapEntry<double>>const&,std::pair<duckdb::HeapEntry<int>,duckdb::HeapEntry<double>>const&)>>
            (__first,__holeIndex,0,__value_00,&local_20);
  return;
}

Assistant:

void Insert(ArenaAllocator &allocator, const K &key, const V &value) {
		D_ASSERT(capacity != 0); // must be initialized

		// If the heap is not full, insert the value into a new slot
		if (size < capacity) {
			heap[size].first.Assign(allocator, key);
			heap[size].second.Assign(allocator, value);
			size++;
			std::push_heap(heap, heap + size, Compare);
		}
		// If the heap is full, check if the value is greater than the smallest value in the heap
		// If it is, assign the new value to the slot and re-heapify
		else if (K_COMPARATOR::Operation(key, heap[0].first.value)) {
			std::pop_heap(heap, heap + size, Compare);
			heap[size - 1].first.Assign(allocator, key);
			heap[size - 1].second.Assign(allocator, value);
			std::push_heap(heap, heap + size, Compare);
		}
		D_ASSERT(std::is_heap(heap, heap + size, Compare));
	}